

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MilStorage.cpp
# Opt level: O2

u_int64_t __thiscall
CoreML::MilStoragePython::MilStoragePythonWriter::write_int4_data
          (MilStoragePythonWriter *this,array_t<signed_char,_16> *data)

{
  SpanSize<18446744073709551615UL> SVar1;
  SpanSize<18446744073709551615UL> SVar2;
  uint64_t uVar3;
  size_t in_RCX;
  Util *this_00;
  pointer ptVar4;
  Span<const_signed_char,_18446744073709551615UL> unpackedValues;
  Span<const_unsigned_char,_18446744073709551615UL> span;
  Span<const_MILBlob::Int4,_18446744073709551615UL> data_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> packedValues;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  ptVar4 = (pointer)(data->super_array).super_buffer.super_object.super_handle.m_ptr[1].ob_refcnt;
  SVar1.m_size = pybind11::array::size(&data->super_array);
  if (SVar1.m_size == 0) {
    ptVar4 = (pointer)0x0;
  }
  unpackedValues.m_size.m_size = SVar1.m_size;
  unpackedValues.m_ptr = ptVar4;
  MILBlob::PackInt8Span<MILBlob::Int4>
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40,unpackedValues);
  SVar2.m_size = pybind11::array::size(&data->super_array);
  this_00 = (Util *)0x0;
  if (local_40._M_impl.super__Vector_impl_data._M_finish +
      -(long)local_40._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    this_00 = (Util *)local_40._M_impl.super__Vector_impl_data._M_start;
  }
  span.m_size.m_size = SVar2.m_size;
  span.m_ptr = local_40._M_impl.super__Vector_impl_data._M_finish +
               -(long)local_40._M_impl.super__Vector_impl_data._M_start;
  data_00 = MILBlob::Util::CastToBitSpan<const_MILBlob::Int4,_const_unsigned_char,_true>
                      (this_00,span,in_RCX);
  uVar3 = MILBlob::Blob::StorageWriter::WriteData<MILBlob::Int4>
                    ((this->m_writer)._M_t.
                     super___uniq_ptr_impl<MILBlob::Blob::StorageWriter,_std::default_delete<MILBlob::Blob::StorageWriter>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_MILBlob::Blob::StorageWriter_*,_std::default_delete<MILBlob::Blob::StorageWriter>_>
                     .super__Head_base<0UL,_MILBlob::Blob::StorageWriter_*,_false>._M_head_impl,
                     data_00);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return uVar3;
}

Assistant:

u_int64_t MilStoragePythonWriter::write_int4_data(const py::array_t<int8_t>& data) {
    // The `data` is stored in int8 because numpy doesn't support int4.
    // First pack those int4 data into uint8 Span, and then cast to int4 Span and write it.
    auto int8SpanData = MILBlob::Util::Span<const int8_t>(data.data(), data.size());
    std::vector<uint8_t> packedValues = MILBlob::PackInt8Span<MILBlob::Int4>(int8SpanData);
    auto packedValuesSpan = MILBlob::Util::Span<const uint8_t>(packedValues.data(), packedValues.size());
    auto int4Span = MILBlob::Util::CastToBitSpan<const MILBlob::Int4>(packedValuesSpan, data.size());
    return m_writer->WriteData<MILBlob::Int4>(int4Span);
}